

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

ExecutionModel
anon_unknown.dwarf_889438::TranslateExecutionModel(EShLanguage stage,bool isMeshShaderEXT)

{
  ExecutionModel EStack_c;
  bool isMeshShaderEXT_local;
  EShLanguage stage_local;
  
  switch(stage) {
  case EShLangVertex:
    EStack_c = ExecutionModelVertex;
    break;
  case EShLangTessControl:
    EStack_c = ExecutionModelTessellationControl;
    break;
  case EShLangTessEvaluation:
    EStack_c = ExecutionModelTessellationEvaluation;
    break;
  case EShLangGeometry:
    EStack_c = ExecutionModelGeometry;
    break;
  case EShLangFragment:
    EStack_c = ExecutionModelFragment;
    break;
  case EShLangCompute:
    EStack_c = ExecutionModelGLCompute;
    break;
  case EShLangRayGen:
    EStack_c = ExecutionModelRayGenerationKHR;
    break;
  case EShLangIntersect:
    EStack_c = ExecutionModelIntersectionKHR;
    break;
  case EShLangAnyHit:
    EStack_c = AnyHitKHR;
    break;
  case EShLangClosestHit:
    EStack_c = ClosestHitKHR;
    break;
  case EShLangMiss:
    EStack_c = ExecutionModelMissKHR;
    break;
  case EShLangCallable:
    EStack_c = CallableKHR;
    break;
  case EShLangTask:
    EStack_c = ExecutionModelTaskNV;
    if (isMeshShaderEXT) {
      EStack_c = ExecutionModelTaskEXT;
    }
    break;
  case EShLangMesh:
    EStack_c = ExecutionModelMeshNV;
    if (isMeshShaderEXT) {
      EStack_c = ExecutionModelMeshEXT;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x150,
                  "spv::ExecutionModel (anonymous namespace)::TranslateExecutionModel(EShLanguage, bool)"
                 );
  }
  return EStack_c;
}

Assistant:

spv::ExecutionModel TranslateExecutionModel(EShLanguage stage, bool isMeshShaderEXT = false)
{
    switch (stage) {
    case EShLangVertex:           return spv::ExecutionModelVertex;
    case EShLangFragment:         return spv::ExecutionModelFragment;
    case EShLangCompute:          return spv::ExecutionModelGLCompute;
    case EShLangTessControl:      return spv::ExecutionModelTessellationControl;
    case EShLangTessEvaluation:   return spv::ExecutionModelTessellationEvaluation;
    case EShLangGeometry:         return spv::ExecutionModelGeometry;
    case EShLangRayGen:           return spv::ExecutionModelRayGenerationKHR;
    case EShLangIntersect:        return spv::ExecutionModelIntersectionKHR;
    case EShLangAnyHit:           return spv::ExecutionModelAnyHitKHR;
    case EShLangClosestHit:       return spv::ExecutionModelClosestHitKHR;
    case EShLangMiss:             return spv::ExecutionModelMissKHR;
    case EShLangCallable:         return spv::ExecutionModelCallableKHR;
    case EShLangTask:             return (isMeshShaderEXT)? spv::ExecutionModelTaskEXT : spv::ExecutionModelTaskNV;
    case EShLangMesh:             return (isMeshShaderEXT)? spv::ExecutionModelMeshEXT: spv::ExecutionModelMeshNV;
    default:
        assert(0);
        return spv::ExecutionModelFragment;
    }
}